

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TracingService * __thiscall
perfetto::internal::InProcessTracingBackend::GetOrCreateService
          (InProcessTracingBackend *this,TaskRunner *task_runner)

{
  bool bVar1;
  InProcessShmFactory *this_00;
  pointer pTVar2;
  unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  local_30;
  unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_> local_28;
  unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
  local_20;
  unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
  shm;
  TaskRunner *task_runner_local;
  InProcessTracingBackend *this_local;
  
  shm._M_t.
  super___uniq_ptr_impl<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::internal::(anonymous_namespace)::InProcessShmFactory_*,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
  .super__Head_base<0UL,_perfetto::internal::(anonymous_namespace)::InProcessShmFactory_*,_false>.
  _M_head_impl = (__uniq_ptr_data<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>,_true,_true>
                  )(__uniq_ptr_data<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>,_true,_true>
                    )task_runner;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->service_);
  if (!bVar1) {
    this_00 = (InProcessShmFactory *)operator_new(8);
    (this_00->super_Factory)._vptr_Factory = (_func_int **)0x0;
    anon_unknown_17::InProcessShmFactory::InProcessShmFactory(this_00);
    ::std::
    unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>>
    ::
    unique_ptr<std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>,void>
              ((unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>>
                *)&local_20,this_00);
    ::std::
    unique_ptr<perfetto::SharedMemory::Factory,std::default_delete<perfetto::SharedMemory::Factory>>
    ::
    unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>,void>
              ((unique_ptr<perfetto::SharedMemory::Factory,std::default_delete<perfetto::SharedMemory::Factory>>
                *)&local_30,&local_20);
    TracingService::CreateInstance
              ((TracingService *)&local_28,&local_30,
               (TaskRunner *)
               shm._M_t.
               super___uniq_ptr_impl<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::internal::(anonymous_namespace)::InProcessShmFactory_*,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
               .
               super__Head_base<0UL,_perfetto::internal::(anonymous_namespace)::InProcessShmFactory_*,_false>
               ._M_head_impl);
    std::unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>::
    operator=(&this->service_,&local_28);
    std::unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>::
    ~unique_ptr(&local_28);
    std::
    unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
    ::~unique_ptr(&local_30);
    pTVar2 = std::
             unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>::
             operator->(&this->service_);
    (*pTVar2->_vptr_TracingService[4])(pTVar2,1);
    std::
    unique_ptr<perfetto::internal::(anonymous_namespace)::InProcessShmFactory,_std::default_delete<perfetto::internal::(anonymous_namespace)::InProcessShmFactory>_>
    ::~unique_ptr(&local_20);
  }
  pTVar2 = std::unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
           ::get(&this->service_);
  return pTVar2;
}

Assistant:

TracingService* InProcessTracingBackend::GetOrCreateService(
    base::TaskRunner* task_runner) {
  if (!service_) {
    std::unique_ptr<InProcessShmFactory> shm(new InProcessShmFactory());
    service_ = TracingService::CreateInstance(std::move(shm), task_runner);
    service_->SetSMBScrapingEnabled(true);
  }
  return service_.get();
}